

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::Run
          (ImageLoadStoreEarlyFragmentTestsTest *this)

{
  bool bVar1;
  bool bVar2;
  GLenum err;
  bool result;
  ImageLoadStoreEarlyFragmentTestsTest *this_local;
  
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,this->m_texture_id,0,'\0',0,0x88ba,0x822e);
  err = glu::CallLogWrapper::glGetError
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper);
  glu::checkError(err,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x269c);
  bVar1 = testEarlyZ(this);
  bVar2 = testEarlyStencil(this);
  if (!bVar2) {
    bVar1 = false;
  }
  if (bVar1) {
    this_local = (ImageLoadStoreEarlyFragmentTestsTest *)0x0;
  }
  else {
    this_local = (ImageLoadStoreEarlyFragmentTestsTest *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool result = true;

		/* Bind texture to first image unit */
		glBindImageTexture(0 /* first image unit */, m_texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
						   GL_READ_WRITE, GL_R32F);
		GLU_EXPECT_NO_ERROR(glGetError(), "BindImageTexture");

		/* Run tests for depth test */
		if (false == testEarlyZ())
		{
			result = false;
		}

		/* Run tests for stencil test */
		if (false == testEarlyStencil())
		{
			result = false;
		}

		/* Return ERROR if any problem was found */
		if (false == result)
		{
			return ERROR;
		}

		/* Done */
		return NO_ERROR;
	}